

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.h
# Opt level: O0

void __thiscall vm_bif_desc::init_synth_hdr(vm_bif_desc *this)

{
  byte bVar1;
  long in_RDI;
  
  memset((void *)(in_RDI + 0x28),0,10);
  bVar1 = 0;
  if (*(int *)(in_RDI + 0x10) != 0) {
    bVar1 = 0x80;
  }
  *(byte *)(in_RDI + 0x28) = (byte)*(undefined4 *)(in_RDI + 8) | bVar1;
  *(char *)(in_RDI + 0x29) = (char)*(undefined4 *)(in_RDI + 0xc);
  return;
}

Assistant:

void init_synth_hdr()
    {
        /* set everything to zeros to start with */
        memset(synth_hdr, 0, sizeof(synth_hdr));

        /* 
         *   Fill in the base arguments field.  This is an 8-bit field
         *   containing the minimum number of arguments, with the high bit
         *   (0x80) set if it's varargs.  
         */
        synth_hdr[0] = (char)(min_argc | (varargs ? 0x80 : 0));

        /* set the optional argument count field */
        synth_hdr[1] = (char)opt_argc;

        /*
         *   We can leave all of the other fields zeroed out:
         *   
         *   - locals, total_stack: the caller doesn't allocate a standard
         *   stack frame for a built-in, so these are unused
         *   
         *   - exception_table_ofs: we don't have any bytecode, so we
         *   obviously don't have a bytecode exception table; leave it zeroed
         *   out to indicate the absence of a table
         *   
         *   - debug_ofs: we don't have any debugger information since we
         *   don't have any bytecode; zero indicates no records 
         */
    }